

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void * __thiscall
xercesc_4_0::DOMDocumentImpl::setUserData
          (DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key,void *data,DOMUserDataHandler *handler)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  MemoryManager *pMVar2;
  bool bVar3;
  uint key2;
  int iVar4;
  ulong uVar5;
  PoolElem *pPVar6;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar7;
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *pRVar8;
  undefined4 extraout_var;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *pKVar9;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar10;
  XMLCh *pXVar11;
  XMLCh XVar12;
  void *pvVar13;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar14;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  enumKeys;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  local_68;
  
  pRVar1 = (this->fUserDataTableKeys).fHashTable;
  if ((key == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*key, uVar5 == 0)) {
    uVar5 = 0;
  }
  else {
    XVar12 = key[1];
    if (XVar12 != L'\0') {
      pXVar11 = key + 2;
      do {
        uVar5 = (ulong)(ushort)XVar12 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar12 = *pXVar11;
        pXVar11 = pXVar11 + 1;
      } while (XVar12 != L'\0');
    }
    uVar5 = uVar5 % pRVar1->fHashModulus;
  }
  pRVar14 = pRVar1->fBucketList[uVar5];
  if (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,key,pRVar14->fKey);
      if (bVar3) goto LAB_0026c88b;
      pRVar14 = pRVar14->fNext;
    } while (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar14 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_0026c88b:
  if (pRVar14 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar6 = (PoolElem *)0x0;
  }
  else {
    pPVar6 = pRVar14->fData;
  }
  if (pPVar6 == (PoolElem *)0x0) {
    key2 = XMLStringPool::addNewEntry(&this->fUserDataTableKeys,key);
  }
  else {
    key2 = pPVar6->fId;
  }
  pRVar8 = this->fUserDataTable;
  if (pRVar8 == (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                 *)0x0) {
    pRVar8 = (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
              *)XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar2 = this->fMemoryManager;
    pRVar8->fMemoryManager = pMVar2;
    pRVar8->fAdoptedElems = true;
    pRVar8->fBucketList =
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          **)0x0;
    pRVar8->fHashModulus = 0x6d;
    pRVar8->fCount = 0;
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
    pRVar8->fBucketList =
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          **)CONCAT44(extraout_var,iVar4);
    pvVar13 = (void *)0x0;
    memset((RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
            **)CONCAT44(extraout_var,iVar4),0,pRVar8->fHashModulus << 3);
    this->fUserDataTable = pRVar8;
  }
  else {
    pRVar7 = pRVar8->fBucketList[(ulong)n % pRVar8->fHashModulus];
    pRVar10 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
               *)0x0;
    if (pRVar7 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                   *)0x0) {
      do {
        if ((pRVar7->fKey2 == key2) && (pRVar10 = pRVar7, (DOMNodeImpl *)pRVar7->fKey1 == n)) break;
        pRVar7 = pRVar7->fNext;
        pRVar10 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                   *)0x0;
      } while (pRVar7 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                          *)0x0);
    }
    if (pRVar10 ==
        (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
         *)0x0) {
      pKVar9 = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0;
    }
    else {
      pKVar9 = pRVar10->fData;
    }
    if (pKVar9 == (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0) {
      pvVar13 = (void *)0x0;
    }
    else {
      pvVar13 = pKVar9->fKey;
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(pRVar8,n,key2);
    }
  }
  if (data == (void *)0x0) {
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator(&local_68,this->fUserDataTable,false,this->fMemoryManager);
    local_68.fLockPrimaryKey = n;
    (*local_68.super_XMLEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>.
      _vptr_XMLEnumerator[4])(&local_68);
    if ((local_68.fCurElem ==
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          *)0x0) && (local_68.fCurHash == (local_68.fToEnum)->fHashModulus)) {
      n->flags = n->flags & 0xfdff;
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator(&local_68);
  }
  else {
    pRVar8 = this->fUserDataTable;
    pKVar9 = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)
             XMemory::operator_new(0x10,this->fMemoryManager);
    pKVar9->fKey = data;
    pKVar9->fValue = handler;
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::put(pRVar8,n,key2,pKVar9);
  }
  return pvVar13;
}

Assistant:

void* DOMDocumentImpl::setUserData(DOMNodeImpl* n, const XMLCh* key, void* data, DOMUserDataHandler* handler)
{
    void* oldData = 0;
    unsigned int keyId=fUserDataTableKeys.addOrFind(key);

    if (!fUserDataTable) {
        // create the table on heap so that it can be cleaned in destructor
        fUserDataTable = new (fMemoryManager) RefHash2KeysTableOf<DOMUserDataRecord, PtrHasher>
        (
            109
            , true
            , fMemoryManager
        );
    }
    else {
        DOMUserDataRecord* oldDataRecord = fUserDataTable->get((void*)n, keyId);

        if (oldDataRecord) {
            oldData = oldDataRecord->getKey();
            fUserDataTable->removeKey((void*)n, keyId);
        }
    }

    if (data) {

        // clone the key first, and create the DOMUserDataRecord
        // create on the heap and adopted by the hashtable which will delete it upon removal.
        fUserDataTable->put((void*)n, keyId, new (fMemoryManager) DOMUserDataRecord(data, handler));
    }
    else {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> enumKeys(fUserDataTable, false, fMemoryManager);
        enumKeys.setPrimaryKey(n);
        if (!enumKeys.hasMoreElements())
            n->hasUserData(false);
    }

    return oldData;
}